

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void DeserializePrimitives(CJSON *json)

{
  ostream *this;
  allocator<char> local_239;
  string local_238;
  PrimitiveTestClass local_218;
  undefined1 local_118 [8];
  PrimitiveTestClass ptc;
  CJSON *json_local;
  
  PrimitiveTestClass::PrimitiveTestClass((PrimitiveTestClass *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "{\"c\":-1,\"d\":432.324324,\"f\":1.342323,\"i\":1048575,\"l\":1048575,\"ld\":423432.346544,\"ll\":1048575,\"pc\":[-1,-1,-1,-1,-1,-1,-1,-1,-1,-1],\"pd\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pf\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pi\":[255,255,255,255,255,255,255,255,255,255],\"pl\":[255,255,255,255,255,255,255,255,255,255],\"pld\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pll\":[255,255,255,255,255,255,255,255,255,255],\"ps\":[255,255,255,255,255,255,255,255,255,255],\"pto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}],\"puc\":[255,255,255,255,255,255,255,255,255,255],\"pui\":[255,255,255,255,255,255,255,255,255,255],\"pul\":[255,255,255,255,255,255,255,255,255,255],\"pull\":[255,255,255,255,255,255,255,255,255,255],\"pus\":[255,255,255,255,255,255,255,255,255,255],\"s\":-1,\"str\":\"Hello World!\",\"uc\":255,\"ui\":1048575,\"ul\":1048575,\"ull\":1048575,\"us\":65535, \"spi\":[10,10,10,10,10,10,10,10,10,10], \"spto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}]}"
             ,&local_239);
  CJSON::Deserialize<PrimitiveTestClass,_nullptr>(&local_218,json,&local_238);
  PrimitiveTestClass::operator=((PrimitiveTestClass *)local_118,&local_218);
  PrimitiveTestClass::~PrimitiveTestClass(&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  this = std::operator<<((ostream *)&std::cout,"PrimitiveTestClass: ");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  PrimitiveTestClass::Print((PrimitiveTestClass *)local_118);
  PrimitiveTestClass::~PrimitiveTestClass((PrimitiveTestClass *)local_118);
  return;
}

Assistant:

void DeserializePrimitives(CJSON &json)
{
    PrimitiveTestClass ptc;
    ptc = json.Deserialize<PrimitiveTestClass>("{\"c\":-1,\"d\":432.324324,\"f\":1.342323,\"i\":1048575,\"l\":1048575,\"ld\":423432.346544,\"ll\":1048575,\"pc\":[-1,-1,-1,-1,-1,-1,-1,-1,-1,-1],\"pd\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pf\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pi\":[255,255,255,255,255,255,255,255,255,255],\"pl\":[255,255,255,255,255,255,255,255,255,255],\"pld\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pll\":[255,255,255,255,255,255,255,255,255,255],\"ps\":[255,255,255,255,255,255,255,255,255,255],\"pto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}],\"puc\":[255,255,255,255,255,255,255,255,255,255],\"pui\":[255,255,255,255,255,255,255,255,255,255],\"pul\":[255,255,255,255,255,255,255,255,255,255],\"pull\":[255,255,255,255,255,255,255,255,255,255],\"pus\":[255,255,255,255,255,255,255,255,255,255],\"s\":-1,\"str\":\"Hello World!\",\"uc\":255,\"ui\":1048575,\"ul\":1048575,\"ull\":1048575,\"us\":65535, \"spi\":[10,10,10,10,10,10,10,10,10,10], \"spto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}]}");
    cout << "PrimitiveTestClass: " << endl;
    ptc.Print();
}